

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void __thiscall
QtPromisePrivate::PromiseDataBase<int,void(int_const&)>::
reject<QtPromisePrivate::PromiseError_const&>
          (PromiseDataBase<int,void(int_const&)> *this,PromiseError *error)

{
  long lVar1;
  void *__tmp;
  void *pvVar2;
  
  pvVar2 = (error->m_data)._M_exception_object;
  if (pvVar2 == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  lVar1 = *(long *)(this + 0x50);
  *(void **)(this + 0x50) = pvVar2;
  if (lVar1 != 0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  PromiseDataBase<int,_void_(const_int_&)>::setSettled
            ((PromiseDataBase<int,_void_(const_int_&)> *)this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }